

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Node * wasm::DataFlow::Node::makeExpr(Expression *expr,Expression *origin)

{
  Node *this;
  Node *ret;
  Expression *origin_local;
  Expression *expr_local;
  
  this = (Node *)operator_new(0x30);
  Node(this,Expr);
  (this->field_1).expr = expr;
  this->origin = origin;
  return this;
}

Assistant:

static Node* makeExpr(Expression* expr, Expression* origin) {
    Node* ret = new Node(Expr);
    ret->expr = expr;
    ret->origin = origin;
    return ret;
  }